

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

P __thiscall ccs::ParserImpl::parseTerm(ParserImpl *this)

{
  bool bVar1;
  Token *token;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ParserImpl *in_RSI;
  P PVar4;
  undefined1 local_60 [80];
  ParserImpl *this_local;
  P *left;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_60[0x47] = 0;
  this_local = this;
  PVar4 = parseStep(this);
  _Var3 = PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  while ((in_RSI->cur_).type == GT) {
    token = anon_unknown_0::Lexer::peek(&in_RSI->lex_);
    bVar1 = couldStartStep(in_RSI,token);
    _Var3._M_pi = extraout_RDX;
    if (!bVar1) break;
    advance(in_RSI);
    peVar2 = std::
             __shared_ptr_access<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<ccs::ast::SelectorLeaf>::shared_ptr
              ((shared_ptr<ccs::ast::SelectorLeaf> *)(local_60 + 0x10),
               (shared_ptr<ccs::ast::SelectorLeaf> *)this);
    parseStep((ParserImpl *)local_60);
    (*peVar2->_vptr_SelectorLeaf[3])(local_60 + 0x20,peVar2,local_60 + 0x10,local_60);
    std::shared_ptr<ccs::ast::SelectorLeaf>::operator=
              ((shared_ptr<ccs::ast::SelectorLeaf> *)this,
               (shared_ptr<ccs::ast::SelectorLeaf> *)(local_60 + 0x20));
    std::shared_ptr<ccs::ast::SelectorLeaf>::~shared_ptr
              ((shared_ptr<ccs::ast::SelectorLeaf> *)(local_60 + 0x20));
    std::shared_ptr<ccs::ast::SelectorLeaf>::~shared_ptr
              ((shared_ptr<ccs::ast::SelectorLeaf> *)local_60);
    std::shared_ptr<ccs::ast::SelectorLeaf>::~shared_ptr
              ((shared_ptr<ccs::ast::SelectorLeaf> *)(local_60 + 0x10));
    _Var3._M_pi = extraout_RDX_00;
  }
  PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (P)PVar4.super___shared_ptr<ccs::ast::SelectorLeaf,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ast::SelectorLeaf::P parseTerm() {
    auto left = parseStep();
    while (cur_.type == Token::GT) {
      // here we have to distinguish another step from a trailing '>'. again,
      // peeking for ident or '(' does the trick.
      if (!couldStartStep(lex_.peek())) return left;
      advance();
      left = left->descendant(left, parseStep());
    }
    return left;
  }